

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Result __thiscall wabt::interp::Table::Set(Table *this,Store *store,u32 offset,Ref ref)

{
  pointer pRVar1;
  bool bVar2;
  Enum EVar3;
  long lVar4;
  
  bVar2 = Store::HasValueType(store,ref,*(ValueType *)&(this->type_).super_ExternType.field_0xc);
  if (bVar2) {
    pRVar1 = (this->elements_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_start;
    EVar3 = Error;
    lVar4 = (long)(this->elements_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pRVar1;
    if ((lVar4 != 0) && ((ulong)offset <= (lVar4 >> 3) - 1U)) {
      pRVar1[offset].index = ref.index;
      EVar3 = Ok;
    }
    return (Result)EVar3;
  }
  __assert_fail("store.HasValueType(ref, type_.element)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                ,0x1fe,"Result wabt::interp::Table::Set(Store &, u32, Ref)");
}

Assistant:

Result Table::Set(Store& store, u32 offset, Ref ref) {
  assert(store.HasValueType(ref, type_.element));
  if (IsValidRange(offset, 1)) {
    elements_[offset] = ref;
    return Result::Ok;
  }
  return Result::Error;
}